

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::OP_HasItem(Var instance,Var index,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  IndexType IVar3;
  BOOL BVar4;
  DynamicObject *instance_00;
  undefined4 *puVar5;
  JavascriptString *propertyString;
  PropertyRecord *local_40;
  PropertyRecord *debugPropertyRecord;
  Var index_local;
  PropertyRecord *propertyRecord;
  uint32 indexVal;
  
  debugPropertyRecord = (PropertyRecord *)index;
  bVar2 = TaggedNumber::Is(instance);
  if (bVar2) {
    instance_00 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                  super_JavascriptLibraryBase).numberPrototype.ptr;
  }
  else {
    instance_00 = (DynamicObject *)VarTo<Js::RecyclableObject>(instance);
  }
  index_local = (Var)0x0;
  IVar3 = GetIndexType(&debugPropertyRecord,scriptContext,(uint32 *)((long)&propertyRecord + 4),
                       (PropertyRecord **)&index_local,false);
  if (IVar3 != IndexType_PropertyId) {
    if (IVar3 == IndexType_Number) {
      BVar4 = HasItem(&instance_00->super_RecyclableObject,propertyRecord._4_4_);
      return BVar4;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xde0,"(indexType == IndexType_PropertyId)",
                                "indexType == IndexType_PropertyId");
    if (!bVar2) goto LAB_0099c5c8;
    *puVar5 = 0;
  }
  if (index_local == (Var)0x0) {
    bVar2 = CanShortcutOnUnknownPropertyName(&instance_00->super_RecyclableObject);
    if (!bVar2) {
      IVar3 = GetIndexTypeFromPrimitive
                        (debugPropertyRecord,scriptContext,(uint32 *)((long)&propertyRecord + 4),
                         (PropertyRecord **)&index_local,true);
      if (IVar3 != IndexType_PropertyId) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0xde4,"(indexType == IndexType_PropertyId)",
                                    "indexType == IndexType_PropertyId");
        if (!bVar2) goto LAB_0099c5c8;
        *puVar5 = 0;
      }
      if (index_local != (Var)0x0) goto LAB_0099c52e;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0xde5,"(propertyRecord != nullptr)","propertyRecord != nullptr");
      if (!bVar2) goto LAB_0099c5c8;
      *puVar5 = 0;
    }
    if (index_local == (Var)0x0) {
      propertyString = JavascriptConversion::ToString(debugPropertyRecord,scriptContext);
      ScriptContext::GetOrAddPropertyRecord(scriptContext,propertyString,&local_40);
      BVar4 = HasProperty(&instance_00->super_RecyclableObject,local_40->pid);
      if (BVar4 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0xdf2,
                                    "(!JavascriptOperators::HasProperty(object, debugPropertyRecord->GetPropertyId()))"
                                    ,
                                    "how did this property come? See OS Bug 2727708 if you see this come from the web"
                                   );
        if (!bVar2) {
LAB_0099c5c8:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      return 0;
    }
  }
LAB_0099c52e:
  BVar4 = HasProperty(&instance_00->super_RecyclableObject,*(PropertyId *)((long)index_local + 8));
  return BVar4;
}

Assistant:

BOOL JavascriptOperators::OP_HasItem(Var instance, Var index, ScriptContext* scriptContext)
    {
        RecyclableObject* object = TaggedNumber::Is(instance) ?
            scriptContext->GetLibrary()->GetNumberPrototype() :
            VarTo<RecyclableObject>(instance);

        uint32 indexVal;
        PropertyRecord const * propertyRecord = nullptr;
        IndexType indexType = GetIndexType(index, scriptContext, &indexVal, &propertyRecord, false);

        if (indexType == IndexType_Number)
        {
            return HasItem(object, indexVal);
        }
        else
        {
            Assert(indexType == IndexType_PropertyId);
            if (propertyRecord == nullptr && !JavascriptOperators::CanShortcutOnUnknownPropertyName(object))
            {
                indexType = GetIndexTypeFromPrimitive(index, scriptContext, &indexVal, &propertyRecord, true);
                Assert(indexType == IndexType_PropertyId);
                Assert(propertyRecord != nullptr);
            }

            if (propertyRecord != nullptr)
            {
                return HasProperty(object, propertyRecord->GetPropertyId());
            }
            else
            {
#if DBG
                JavascriptString* indexStr = JavascriptConversion::ToString(index, scriptContext);
                PropertyRecord const * debugPropertyRecord;
                scriptContext->GetOrAddPropertyRecord(indexStr, &debugPropertyRecord);
                AssertMsg(!JavascriptOperators::HasProperty(object, debugPropertyRecord->GetPropertyId()), "how did this property come? See OS Bug 2727708 if you see this come from the web");
#endif

                return FALSE;
            }
        }
    }